

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleTestApprovalsTests.cpp
# Opt level: O0

void __thiscall
GoogleTestApprovalsTests_SpecificReporter_Test::TestBody
          (GoogleTestApprovalsTests_SpecificReporter_Test *this)

{
  Options *in_stack_ffffffffffffff10;
  Options *in_stack_ffffffffffffff38;
  char (*in_stack_ffffffffffffff40) [20];
  Reporter *in_stack_ffffffffffffff58;
  Options *in_stack_ffffffffffffff60;
  AraxisMergeReporter *in_stack_ffffffffffffff70;
  
  ApprovalTests::Windows::AraxisMergeReporter::AraxisMergeReporter(in_stack_ffffffffffffff70);
  ApprovalTests::Options::Options(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  verify<char[20],int>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  ApprovalTests::Options::~Options(in_stack_ffffffffffffff10);
  ApprovalTests::Windows::AraxisMergeReporter::~AraxisMergeReporter((AraxisMergeReporter *)0x113f1d)
  ;
  return;
}

Assistant:

TEST(GoogleTestApprovalsTests, SpecificReporter)
{
    // begin-snippet: basic_approval_with_reporter
    using namespace ApprovalTests;
    Approvals::verify("text to be verified", Options(Windows::AraxisMergeReporter()));
    // end-snippet
}